

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

bool validateblock(char *s)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    cVar1 = *s;
    if (cVar1 == '\"') {
      s = parsestring(s + 1);
      if (*s != '\"') {
        return false;
      }
    }
    else {
      iVar2 = (int)uVar3;
      if (cVar1 == '(') {
LAB_0012d7f5:
        if (99 < iVar2) {
          return false;
        }
        uVar3 = (ulong)(iVar2 + 1);
        validateblock::brakstack[iVar2] = cVar1;
      }
      else if (cVar1 == ')') {
        if (iVar2 < 1) {
          return false;
        }
        uVar3 = (ulong)(iVar2 - 1);
        if (validateblock::brakstack[uVar3] != '(') {
          return false;
        }
      }
      else if (cVar1 == '/') {
        if (s[1] == '/') {
          return false;
        }
      }
      else {
        if (cVar1 == '[') goto LAB_0012d7f5;
        if (cVar1 == ']') {
          if (iVar2 < 1) {
            return false;
          }
          uVar3 = (ulong)(iVar2 - 1);
          if (validateblock::brakstack[uVar3] != '[') {
            return false;
          }
        }
        else {
          if (cVar1 == '\0') {
            return iVar2 == 0;
          }
          if (cVar1 == '\f') {
            return false;
          }
        }
      }
    }
    s = s + 1;
  } while( true );
}

Assistant:

bool validateblock(const char *s)
{
    const int maxbrak = 100;
    static char brakstack[maxbrak];
    int brakdepth = 0;
    for(; *s; s++) switch(*s)
    {
        case '[': case '(': if(brakdepth >= maxbrak) return false; brakstack[brakdepth++] = *s; break;
        case ']': if(brakdepth <= 0 || brakstack[--brakdepth] != '[') return false; break;
        case ')': if(brakdepth <= 0 || brakstack[--brakdepth] != '(') return false; break;
        case '"': s = parsestring(s + 1); if(*s != '"') return false; break;
        case '/': if(s[1] == '/') return false; break;
        case '\f': return false;
    }
    return brakdepth == 0;
}